

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsPosixFileReader.cpp
# Opt level: O1

void __thiscall xs::posix::FileReader::stop(FileReader *this)

{
  if (this->m_isRunning == true) {
    (this->m_buf).m_canceled = 1;
    deSemaphore_increment((this->m_buf).m_empty);
    deSemaphore_increment((this->m_buf).m_fill);
    de::Thread::join(&this->super_Thread);
    deFile_destroy(this->m_file);
    this->m_file = (deFile *)0x0;
    de::BlockBuffer<unsigned_char>::clear(&this->m_buf);
    this->m_isRunning = false;
  }
  return;
}

Assistant:

void FileReader::stop (void)
{
	if (!m_isRunning)
		return; // Nothing to do.

	m_buf.cancel();

	// Join thread.
	join();

	// Destroy file.
	deFile_destroy(m_file);
	m_file = DE_NULL;

	// Reset buffer.
	m_buf.clear();

	m_isRunning = false;
}